

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::
TestParsingMergeLite_RepeatedFieldsGenerator
          (TestParsingMergeLite_RepeatedFieldsGenerator *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TestParsingMergeLite_RepeatedFieldsGenerator_005875a0;
  (this->field_0)._impl_.field1_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 8) = 0;
  *(int *)((long)&this->field_0 + 0xc) = 0;
  (this->field_0)._impl_.field1_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.field2_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x20) = 0;
  *(int *)((long)&this->field_0 + 0x24) = 0;
  (this->field_0)._impl_.field2_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.field3_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x38) = 0;
  *(int *)((long)&this->field_0 + 0x3c) = 0;
  (this->field_0)._impl_.field3_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.group1_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x50) = 0;
  *(int *)((long)&this->field_0 + 0x54) = 0;
  (this->field_0)._impl_.group1_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.group2_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x68) = 0;
  *(int *)((long)&this->field_0 + 0x6c) = 0;
  (this->field_0)._impl_.group2_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.ext1_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x80) = 0;
  *(int *)((long)&this->field_0 + 0x84) = 0;
  (this->field_0)._impl_.ext1_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.ext2_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x98) = 0;
  *(int *)((long)&this->field_0 + 0x9c) = 0;
  (this->field_0)._impl_.ext2_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_._cached_size_.atom_ = 0;
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena) {
    ptr_ = reinterpret_cast<intptr_t>(arena);
  }